

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_cell_volume(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_STATUS RVar1;
  uint uVar2;
  REF_CELL *ppRVar3;
  undefined8 uVar4;
  char *pcVar5;
  uint cell;
  long lVar6;
  REF_DBL volume;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [30];
  
  ppRVar3 = ref_grid->cell + 3;
  if (ref_grid->twod == 0) {
    ppRVar3 = ref_grid->cell + 8;
  }
  ref_cell = *ppRVar3;
  if (0 < ref_cell->max) {
    ref_node = ref_grid->node;
    cell = 0;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        if (ref_grid->twod == 0) {
          uVar2 = ref_node_tet_vol(ref_node,local_a8,&local_b0);
          if (uVar2 != 0) {
            pcVar5 = "vol";
            uVar4 = 0x1a5;
            goto LAB_001eb885;
          }
        }
        else {
          uVar2 = ref_node_tri_area(ref_node,local_a8,&local_b0);
          if (uVar2 != 0) {
            pcVar5 = "area";
            uVar4 = 0x1a3;
LAB_001eb885:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,uVar4,"ref_validation_cell_volume",(ulong)uVar2,pcVar5);
            return uVar2;
          }
        }
        if (local_b0 <= 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1ac,"ref_validation_cell_volume","negative volume tet");
          printf("cell %d volume %e\n",local_b0,(ulong)cell);
          if (ref_cell->node_per < 1) {
            return 1;
          }
          lVar6 = 0;
          do {
            ref_node_location(ref_node,local_a8[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < ref_cell->node_per);
          return 1;
        }
      }
      cell = cell + 1;
    } while ((int)cell < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}